

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<long,true>(char *buf,idx_t len,long *result,bool strict)

{
  byte bVar1;
  long lVar2;
  undefined7 in_register_00000009;
  long lVar3;
  idx_t iVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  IntegerCastData<short> local_6a;
  IntegerDecimalCastData<long> local_68;
  undefined8 local_48;
  undefined8 local_40;
  long *local_38;
  
  lVar2 = CONCAT71(in_register_00000009,strict);
  if (len != 0) {
    uVar13 = 0;
    do {
      bVar1 = buf[uVar13];
      lVar2 = CONCAT71((int7)((ulong)lVar2 >> 8),bVar1);
      uVar10 = (uint)bVar1;
      if ((4 < uVar10 - 9) && (uVar10 != 0x20)) {
        if (uVar10 == 0x2d) {
          uVar15 = len - uVar13;
          lVar2 = 0;
          uVar14 = 1;
          goto LAB_001eb4d0;
        }
        if (bVar1 != 0x30 || len - 1 == uVar13) {
LAB_001eb710:
          local_40 = CONCAT44(local_40._4_4_,3);
          uVar15 = len - uVar13;
          local_48 = (ulong)(bVar1 == 0x2b);
          lVar2 = 0;
          uVar14 = local_48;
          goto LAB_001eb72c;
        }
        cVar9 = buf[uVar13 + 1];
        if (cVar9 != 'B') {
          if (cVar9 != 'x') {
            if (cVar9 == 'b') goto LAB_001eba41;
            if (cVar9 != 'X') goto LAB_001eb710;
          }
          lVar2 = 0;
          uVar14 = 1;
          goto LAB_001eb60f;
        }
LAB_001eba41:
        uVar14 = ~uVar13 + len;
        bVar19 = 1 < uVar14;
        if (!bVar19) {
          lVar2 = 0;
          goto LAB_001eb56d;
        }
        lVar2 = 0;
        uVar15 = 1;
        goto LAB_001eba5a;
      }
      uVar13 = uVar13 + 1;
    } while (len != uVar13);
  }
  bVar19 = false;
  goto LAB_001eb56d;
  while( true ) {
    uVar11 = uVar14 + 1;
    if (lVar2 < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar18 = false;
    }
    else {
      lVar2 = lVar2 * 10 - (ulong)bVar1;
      bVar18 = true;
      if ((~uVar14 + len != uVar13) && (buf[uVar13 + 1 + uVar14] == '_')) {
        uVar11 = uVar14 + 2;
        if ((len - uVar14) - 2 == uVar13) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar13 + uVar11] - 0x30U) < 10;
        }
      }
    }
    bVar19 = false;
    uVar14 = uVar11;
    if (!bVar18) break;
LAB_001eb4d0:
    if (uVar15 <= uVar14) goto LAB_001ebd5b;
    bVar1 = buf[uVar13 + uVar14] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar13 + uVar14] == '.') {
        uVar11 = uVar14 + 1;
        if (uVar11 < uVar15) {
          iVar5 = 0;
          if (9 < (byte)(buf[uVar13 + 1 + uVar14] - 0x30U)) goto LAB_001ebced;
          iVar8 = 1;
        }
        else {
          iVar5 = 3;
LAB_001ebced:
          iVar8 = 1;
          if (1 < uVar14) {
            iVar8 = iVar5;
          }
        }
        uVar14 = uVar11;
        if (iVar8 == 3) goto LAB_001ebd5b;
        if (iVar8 != 0) goto LAB_001ebdce;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar13 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar14] & 0x3f) & 1) != 0)) {
        uVar11 = uVar14 + 1;
        uVar14 = uVar11;
        if (uVar15 <= uVar11) goto LAB_001ebd5b;
        goto LAB_001ebd2f;
      }
      break;
    }
  }
  goto LAB_001eb56d;
  while (uVar11 = uVar11 + 1, uVar14 = uVar15, uVar15 != uVar11) {
LAB_001ebd2f:
    if ((0x20 < (ulong)(byte)buf[uVar13 + uVar11]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar11] & 0x3f) & 1) == 0)) goto LAB_001ebdce;
  }
LAB_001ebd5b:
  bVar19 = 1 < uVar14;
  goto LAB_001eb56d;
  while( true ) {
    uVar11 = uVar14 + 1;
    bVar18 = false;
    if (lVar2 <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      lVar2 = lVar2 * 10 + (ulong)bVar1;
      bVar18 = true;
      if ((~uVar14 + len != uVar13) && (buf[uVar13 + 1 + uVar14] == '_')) {
        uVar11 = uVar14 + 2;
        if ((len - uVar14) - 2 == uVar13) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar13 + uVar11] - 0x30U) < 10;
        }
      }
    }
    bVar19 = false;
    uVar14 = uVar11;
    if (!bVar18) break;
LAB_001eb72c:
    if (uVar15 <= uVar14) goto LAB_001ebdc3;
    bVar1 = buf[uVar13 + uVar14] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar13 + uVar14] == '.') {
        uVar11 = uVar14 + 1;
        if ((uVar11 < uVar15) &&
           (local_40 = (ulong)local_40._4_4_ << 0x20, (byte)(buf[uVar13 + 1 + uVar14] - 0x30U) < 10)
           ) {
          iVar5 = 1;
        }
        else {
          iVar5 = 1;
          if (local_48 < uVar14) {
            iVar5 = (int)local_40;
          }
        }
        uVar14 = uVar11;
        if (iVar5 == 3) goto LAB_001ebdc3;
        if (iVar5 != 0) goto LAB_001ebdce;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar13 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar14] & 0x3f) & 1) != 0)) {
        uVar11 = uVar14 + 1;
        uVar14 = uVar11;
        if (uVar15 <= uVar11) goto LAB_001ebdc3;
        goto LAB_001ebda3;
      }
      break;
    }
  }
  goto LAB_001eb56d;
  while (uVar11 = uVar11 + 1, uVar14 = uVar15, uVar15 != uVar11) {
LAB_001ebda3:
    if ((0x20 < (ulong)(byte)buf[uVar13 + uVar11]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar11] & 0x3f) & 1) == 0)) goto LAB_001ebdce;
  }
LAB_001ebdc3:
  bVar19 = local_48 < uVar14;
  goto LAB_001eb56d;
LAB_001eb60f:
  do {
    if (~uVar13 + len <= uVar14) goto LAB_001ebd5b;
    bVar1 = buf[uVar13 + 1 + uVar14];
    bVar7 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar7 = bVar1;
    }
    if (9 < (byte)(bVar7 - 0x30)) {
      bVar19 = false;
      if ((0x25 < bVar7 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar9 = -0x57;
    if ((char)bVar7 < 'a') {
      cVar9 = -0x30;
    }
    uVar15 = uVar14 + 1;
    if (((len - uVar14) - 2 == uVar13) || (buf[uVar13 + 2 + uVar14] != '_')) {
LAB_001eb6dd:
      uVar14 = (ulong)((byte)(cVar9 + bVar7) >> 4) ^ 0x7ffffffffffffff;
      lVar3 = lVar2;
      if (lVar2 <= (long)uVar14) {
        lVar3 = lVar2 * 0x10 + (ulong)(byte)(cVar9 + bVar7);
      }
      bVar18 = lVar2 <= (long)uVar14;
      lVar2 = lVar3;
    }
    else {
      uVar15 = uVar14 + 2;
      if ((len - uVar14) - 3 != uVar13) {
        if (9 < (byte)(buf[uVar13 + 3 + uVar14] - 0x30U)) {
          bVar18 = false;
          uVar10 = (byte)buf[uVar13 + 3 + uVar14] - 0x41;
          if ((0x25 < uVar10) || ((0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_001eb701;
        }
        goto LAB_001eb6dd;
      }
      bVar18 = false;
    }
LAB_001eb701:
    bVar19 = false;
    uVar14 = uVar15;
  } while (bVar18);
  goto LAB_001eb56d;
LAB_001ebdce:
  bVar19 = false;
  goto LAB_001eb56d;
  while( true ) {
    bVar1 = buf[uVar13 + uVar15] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar13 + uVar15] != '.') goto LAB_001ec00f;
      uVar11 = uVar15 + 1;
      if (uVar14 <= uVar11) {
        iVar8 = 3;
        uVar16 = uVar11;
        goto LAB_001ebfe9;
      }
      local_68.decimal = 0;
      local_48 = CONCAT44(local_48._4_4_,3);
      uVar12 = uVar11;
      goto LAB_001ebc53;
    }
    uVar11 = uVar15 + 1;
    if (local_68.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar19 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar1;
      bVar19 = true;
      if ((~uVar15 + len != uVar13) && (buf[uVar13 + 1 + uVar15] == '_')) {
        uVar11 = uVar15 + 2;
        if ((len - uVar15) - 2 == uVar13) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar13 + uVar11] - 0x30U) < 10;
        }
      }
    }
    uVar15 = uVar11;
    if (!bVar19) break;
LAB_001eb803:
    if (uVar14 <= uVar15) goto LAB_001ebc03;
  }
  goto LAB_001eb5a4;
  while( true ) {
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar16 = uVar12 + 1;
    if (((~uVar12 + len != uVar13) && (buf[uVar13 + 1 + uVar12] == '_')) &&
       ((uVar16 = uVar12 + 2, (len - uVar12) - 2 == uVar13 ||
        (9 < (byte)(buf[uVar13 + uVar16] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar5 = 1;
      goto LAB_001ebffe;
    }
    uVar12 = uVar16;
    if (uVar14 <= uVar16) break;
LAB_001ebc53:
    bVar1 = buf[uVar13 + uVar12] - 0x30;
    if (9 < bVar1) {
      local_48 = (ulong)local_48._4_4_ << 0x20;
      uVar16 = uVar12;
      break;
    }
  }
  local_68._18_6_ = 0;
  iVar8 = (int)local_48;
LAB_001ebfe9:
  iVar5 = 1;
  if (uVar11 < uVar16) {
    iVar5 = iVar8;
  }
  if (1 < uVar15) {
    iVar5 = iVar8;
  }
LAB_001ebffe:
  uVar15 = uVar16;
  if (iVar5 == 3) {
LAB_001ebc03:
    bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                       (&local_68);
    if (bVar19) {
      bVar19 = 1 < uVar15;
      goto LAB_001eb5a6;
    }
  }
  else if (iVar5 == 0) {
LAB_001ec00f:
    bVar1 = buf[uVar13 + uVar15];
    if (bVar1 - 9 < 5) {
LAB_001ec021:
      uVar11 = uVar15 + 1;
      uVar15 = uVar11;
      if (uVar11 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar13 + uVar11]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar11] & 0x3f) & 1) == 0))
          goto LAB_001eb5a4;
          uVar11 = uVar11 + 1;
          uVar15 = uVar14;
        } while (uVar14 != uVar11);
      }
      goto LAB_001ebc03;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar15 != 1) && (uVar15 + 1 < uVar14)) {
        local_6a.result = 0;
        pcVar6 = buf + uVar13 + uVar15 + 1;
        iVar4 = ~uVar13 + (len - uVar15);
        if (*pcVar6 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<long>,true>
                             (&local_68,local_6a.result);
          goto LAB_001eb5a6;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_001ec021;
  }
  goto LAB_001eb5a4;
  while( true ) {
    bVar1 = buf[uVar13 + uVar15] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar13 + uVar15] != '.') goto LAB_001ec0fb;
      uVar12 = uVar15 + 1;
      if (uVar14 <= uVar12) {
        iVar8 = 3;
        uVar17 = uVar12;
        goto LAB_001ec0d6;
      }
      local_68.decimal = 0;
      local_48 = CONCAT44(local_48._4_4_,3);
      uVar16 = uVar12;
      goto LAB_001ebef5;
    }
    uVar12 = uVar15 + 1;
    bVar19 = false;
    if (local_68.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar1;
      bVar19 = true;
      if ((~uVar15 + len != uVar13) && (buf[uVar13 + 1 + uVar15] == '_')) {
        uVar12 = uVar15 + 2;
        if ((len - uVar15) - 2 == uVar13) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar13 + uVar12] - 0x30U) < 10;
        }
      }
    }
    uVar15 = uVar12;
    if (!bVar19) break;
LAB_001ebb34:
    if (uVar14 <= uVar15) goto LAB_001ebddd;
  }
  goto LAB_001eb5a4;
  while( true ) {
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar17 = uVar16 + 1;
    if (((~uVar16 + len != uVar13) && (buf[uVar13 + 1 + uVar16] == '_')) &&
       ((uVar17 = uVar16 + 2, (len - uVar16) - 2 == uVar13 ||
        (9 < (byte)(buf[uVar13 + uVar17] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar5 = 1;
      goto LAB_001ec0ea;
    }
    uVar16 = uVar17;
    if (uVar14 <= uVar17) break;
LAB_001ebef5:
    bVar1 = buf[uVar13 + uVar16] - 0x30;
    local_40 = uVar12;
    if (9 < bVar1) {
      local_48 = (ulong)local_48._4_4_ << 0x20;
      uVar17 = uVar16;
      break;
    }
  }
  local_68._18_6_ = 0;
  iVar8 = (int)local_48;
LAB_001ec0d6:
  iVar5 = 1;
  if (uVar12 < uVar17) {
    iVar5 = iVar8;
  }
  if (uVar11 < uVar15) {
    iVar5 = iVar8;
  }
LAB_001ec0ea:
  uVar15 = uVar17;
  if (iVar5 == 3) {
LAB_001ebddd:
    bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                       (&local_68);
    if (bVar19) {
      bVar19 = uVar11 < uVar15;
      goto LAB_001eb5a6;
    }
  }
  else if (iVar5 == 0) {
LAB_001ec0fb:
    bVar1 = buf[uVar13 + uVar15];
    if (bVar1 - 9 < 5) {
LAB_001ec10d:
      uVar12 = uVar15 + 1;
      uVar15 = uVar12;
      if (uVar12 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar13 + uVar12]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar12] & 0x3f) & 1) == 0))
          goto LAB_001eb5a4;
          uVar12 = uVar12 + 1;
          uVar15 = uVar14;
        } while (uVar14 != uVar12);
      }
      goto LAB_001ebddd;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar15 != uVar11) && (uVar15 + 1 < uVar14)) {
        local_6a.result = 0;
        pcVar6 = buf + uVar13 + uVar15 + 1;
        iVar4 = ~uVar13 + (len - uVar15);
        if (*pcVar6 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<long>,false>
                             (&local_68,local_6a.result);
          goto LAB_001eb5a6;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_001ec10d;
  }
  goto LAB_001eb5a4;
LAB_001eb929:
  do {
    if (~uVar13 + len <= uVar14) {
      bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                         (&local_68);
      bVar19 = 1 < uVar14 && bVar19;
      goto LAB_001eb5a6;
    }
    bVar1 = buf[uVar13 + 1 + uVar14];
    bVar7 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar7 = bVar1;
    }
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x25 < bVar7 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar9 = -0x57;
    if ((char)bVar7 < 'a') {
      cVar9 = -0x30;
    }
    uVar15 = uVar14 + 1;
    if (((len - uVar14) - 2 == uVar13) || (buf[uVar13 + 2 + uVar14] != '_')) {
LAB_001eb9fa:
      uVar14 = (ulong)((byte)(cVar9 + bVar7) >> 4) ^ 0x7ffffffffffffff;
      lVar2 = local_68.result;
      if (local_68.result <= (long)uVar14) {
        lVar2 = local_68.result * 0x10 + (ulong)(byte)(cVar9 + bVar7);
      }
      bVar19 = local_68.result <= (long)uVar14;
      local_68.result = lVar2;
    }
    else {
      uVar15 = uVar14 + 2;
      if ((len - uVar14) - 3 != uVar13) {
        if (9 < (byte)(buf[uVar13 + 3 + uVar14] - 0x30U)) {
          uVar10 = (byte)buf[uVar13 + 3 + uVar14] - 0x41;
          bVar19 = false;
          if ((0x25 < uVar10) ||
             (bVar19 = false, (0x3f0000003fU >> ((ulong)uVar10 & 0x3f) & 1) == 0))
          goto LAB_001eba21;
        }
        goto LAB_001eb9fa;
      }
      bVar19 = false;
    }
LAB_001eba21:
    uVar14 = uVar15;
  } while (bVar19);
  goto LAB_001eb5a4;
  while( true ) {
    if (0x3fffffffffffffff < local_68.result) goto LAB_001eb5a4;
    local_68.result = uVar11 + local_68.result * 2;
    uVar15 = uVar12;
    if (uVar14 <= uVar12) break;
LAB_001ebe19:
    if (buf[uVar13 + 1 + uVar15] == '0') {
      uVar11 = 0;
    }
    else {
      uVar11 = 1;
      if (buf[uVar13 + 1 + uVar15] != '1') goto LAB_001eb5a4;
    }
    uVar12 = uVar15 + 1;
    if (((len - uVar15) - 2 != uVar13) && (buf[uVar13 + 2 + uVar15] == '_')) {
      if (((len - uVar15) - 3 == uVar13) || ((buf[uVar13 + 3 + uVar15] & 0xfeU) != 0x30))
      goto LAB_001eb5a4;
      uVar12 = uVar15 + 2;
    }
  }
LAB_001ebea5:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                     (&local_68);
  bVar19 = bVar19 && 1 < uVar14;
  goto LAB_001eb5a6;
  while( true ) {
    uVar12 = uVar15 + 1;
    if (((len - uVar15) - 2 != uVar13) && (buf[uVar13 + 2 + uVar15] == '_')) {
      if (((len - uVar15) - 3 == uVar13) || ((buf[uVar13 + 3 + uVar15] & 0xfeU) != 0x30))
      goto LAB_001ebdce;
      uVar12 = uVar15 + 2;
    }
    uVar15 = uVar12;
    if (0x3fffffffffffffff < lVar2) goto LAB_001ebdce;
    lVar2 = uVar11 + lVar2 * 2;
    bVar19 = true;
    if (uVar14 <= uVar15) break;
LAB_001eba5a:
    bVar19 = false;
    uVar11 = 0;
    if ((buf[uVar13 + 1 + uVar15] != '0') && (uVar11 = 1, buf[uVar13 + 1 + uVar15] != '1')) break;
  }
LAB_001eb56d:
  if (bVar19) {
    *result = lVar2;
    bVar19 = true;
  }
  else {
    local_38 = result;
    if (len != 0) {
      uVar13 = 0;
      do {
        bVar1 = buf[uVar13];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_68._16_8_ = 0;
          local_68.result = 0;
          local_68.decimal = 0;
          uVar14 = len - uVar13;
          local_68.decimal_digits = 0;
          if (bVar1 == 0x2d) {
            local_68.result = 0;
            uVar15 = 1;
            goto LAB_001eb803;
          }
          if (bVar1 != 0x30 || len - 1 == uVar13) {
LAB_001ebb20:
            uVar11 = (ulong)(bVar1 == 0x2b);
            local_68.result = 0;
            uVar15 = uVar11;
            goto LAB_001ebb34;
          }
          cVar9 = buf[uVar13 + 1];
          if (cVar9 != 'B') {
            if (cVar9 != 'x') {
              if (cVar9 == 'b') goto LAB_001ebdfa;
              if (cVar9 != 'X') goto LAB_001ebb20;
            }
            local_68.result = 0;
            uVar14 = 1;
            goto LAB_001eb929;
          }
LAB_001ebdfa:
          uVar14 = ~uVar13 + len;
          if (uVar14 < 2) goto LAB_001ebea5;
          local_68.result = 0;
          uVar15 = 1;
          goto LAB_001ebe19;
        }
        uVar13 = uVar13 + 1;
      } while (len != uVar13);
    }
LAB_001eb5a4:
    bVar19 = false;
LAB_001eb5a6:
    if (bVar19 != false) {
      *local_38 = local_68.result;
    }
  }
  return bVar19;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}